

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_check_magic.c
# Opt level: O3

char * write_all_states(char *buff,uint states)

{
  size_t sVar1;
  char *__src;
  uint uVar2;
  
  *buff = '\0';
  uVar2 = -states & states;
  do {
    if (uVar2 == 0) {
      return buff;
    }
    if ((int)uVar2 < 0x10) {
      __src = "new";
      if (uVar2 != 1) {
        if (uVar2 == 2) {
          __src = "header";
        }
        else if (uVar2 == 4) {
          __src = "data";
        }
        else {
LAB_0042d892:
          __src = "??";
        }
      }
    }
    else if (uVar2 == 0x10) {
      __src = "eof";
    }
    else if (uVar2 == 0x20) {
      __src = "closed";
    }
    else {
      if (uVar2 != 0x8000) goto LAB_0042d892;
      __src = "fatal";
    }
    strcat(buff,__src);
    if (uVar2 != states) {
      sVar1 = strlen(buff);
      (buff + sVar1)[0] = '/';
      (buff + sVar1)[1] = '\0';
    }
    states = states ^ uVar2;
    uVar2 = -states & states;
  } while( true );
}

Assistant:

static char *
write_all_states(char *buff, unsigned int states)
{
	unsigned int lowbit;

	buff[0] = '\0';

	/* A trick for computing the lowest set bit. */
	while ((lowbit = states & (1 + ~states)) != 0) {
		states &= ~lowbit;		/* Clear the low bit. */
		strcat(buff, state_name(lowbit));
		if (states != 0)
			strcat(buff, "/");
	}
	return buff;
}